

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

string * __thiscall
soul::SourceCodeOperations::ModuleDeclaration::getName_abi_cxx11_
          (string *__return_storage_ptr__,ModuleDeclaration *this)

{
  string *psVar1;
  
  psVar1 = Identifier::toString_abi_cxx11_(&this->module->name);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeOperations::ModuleDeclaration::getName() const
{
    return module.name.toString();
}